

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

TEdge * ClipperLib::RemoveEdge(TEdge *e)

{
  TEdge *pTVar1;
  TEdge *pTVar2;
  
  pTVar1 = e->Next;
  pTVar2 = e->Prev;
  pTVar2->Next = pTVar1;
  pTVar1->Prev = pTVar2;
  e->Prev = (TEdge *)0x0;
  return pTVar1;
}

Assistant:

TEdge* RemoveEdge(TEdge* e)
{
  //removes e from double_linked_list (but without removing from memory)
  e->Prev->Next = e->Next;
  e->Next->Prev = e->Prev;
  TEdge* result = e->Next;
  e->Prev = 0; //flag as removed (see ClipperBase.Clear)
  return result;
}